

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::BeginRenderPass
          (DeviceContextVkImpl *this,BeginRenderPassAttribs *Attribs)

{
  vector<VkClearValue,_std::allocator<VkClearValue>_> *this_00;
  uint uVar1;
  FramebufferVkImpl *pFVar2;
  RenderPassVkImpl *pRVar3;
  OptimizedClearValue *pOVar4;
  pointer pVVar5;
  TextureFormatAttribs *pTVar6;
  char (*in_RCX) [34];
  Uint32 i;
  ulong uVar7;
  VkClearValue *pClearValues;
  long lVar8;
  long lVar9;
  string msg;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::BeginRenderPass
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs);
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject ==
      (RenderPassVkImpl *)0x0) {
    FormatString<char[26],char[31]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pActiveRenderPass != nullptr",(char (*) [31])in_RCX);
    in_RCX = (char (*) [34])0x7e6;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x7e6);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundFramebuffer.m_pObject ==
      (FramebufferVkImpl *)0x0) {
    FormatString<char[26],char[31]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pBoundFramebuffer != nullptr",(char (*) [31])in_RCX);
    in_RCX = (char (*) [34])0x7e7;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x7e7);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (this->m_vkRenderPass != (VkRenderPass)0x0) {
    FormatString<char[26],char[33]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_vkRenderPass == VK_NULL_HANDLE",(char (*) [33])in_RCX);
    in_RCX = (char (*) [34])0x7e8;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x7e8);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (this->m_vkFramebuffer != (VkFramebuffer)0x0) {
    FormatString<char[26],char[34]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_vkFramebuffer == VK_NULL_HANDLE",in_RCX);
    in_RCX = (char (*) [34])0x7e9;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x7e9);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((this->m_DynamicRenderingInfo)._M_t.
      super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
      ._M_t.
      super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
      .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl !=
      (RenderingInfoWrapper *)0x0) {
    FormatString<char[26],char[24]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!m_DynamicRenderingInfo",(char (*) [24])in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x7ea);
    std::__cxx11::string::~string((string *)&msg);
  }
  pFVar2 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundFramebuffer.m_pObject;
  this->m_vkRenderPass =
       (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject)->
       m_VkRenderPass).m_VkObject;
  this->m_vkFramebuffer = (pFVar2->m_VkFramebuffer).m_VkObject;
  if ((ulong)Attribs->ClearValueCount == 0) {
    pClearValues = (VkClearValue *)0x0;
  }
  else {
    this_00 = &this->m_vkClearValues;
    std::vector<VkClearValue,_std::allocator<VkClearValue>_>::resize
              (this_00,(ulong)Attribs->ClearValueCount);
    pRVar3 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject;
    lVar9 = 0x18;
    lVar8 = 0;
    uVar7 = 0;
    while( true ) {
      uVar1 = (pRVar3->super_RenderPassBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
              .m_Desc.AttachmentCount;
      if (Attribs->ClearValueCount < uVar1) {
        uVar1 = Attribs->ClearValueCount;
      }
      if (uVar1 <= uVar7) break;
      pOVar4 = Attribs->pClearValues;
      pVVar5 = (this_00->super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pTVar6 = GetTextureFormatAttribs
                         (*(TEXTURE_FORMAT *)
                           ((long)&((pRVar3->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                                    super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                                    .m_Desc.pAttachments)->Format + lVar8));
      if ((byte)(pTVar6->ComponentType - COMPONENT_TYPE_DEPTH) < 2) {
        *(undefined4 *)((long)pVVar5 + lVar8) = *(undefined4 *)((long)pOVar4->Color + lVar9 + -8);
        *(uint *)((long)pVVar5 + lVar8 + 4) = (uint)*(byte *)((long)pOVar4->Color + lVar9 + -4);
      }
      else {
        *(undefined4 *)((long)pVVar5 + lVar8) = *(undefined4 *)((long)pOVar4->Color + lVar9 + -0x18)
        ;
        *(undefined4 *)((long)pVVar5 + lVar8 + 4) =
             *(undefined4 *)((long)pOVar4->Color + lVar9 + -0x14);
        *(undefined4 *)((long)pVVar5 + lVar8 + 8) =
             *(undefined4 *)((long)pOVar4->Color + lVar9 + -0x10);
        *(undefined4 *)((long)pVVar5 + lVar8 + 0xc) =
             *(undefined4 *)((long)pOVar4->Color + lVar9 + -0xc);
      }
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 0x1c;
      lVar8 = lVar8 + 0x10;
    }
    pClearValues = (this_00->super__Vector_base<VkClearValue,_std::allocator<VkClearValue>_>).
                   _M_impl.super__Vector_impl_data._M_start;
  }
  EnsureVkCmdBuffer(this);
  VulkanUtilities::VulkanCommandBuffer::BeginRenderPass
            (&this->m_CommandBuffer,this->m_vkRenderPass,this->m_vkFramebuffer,
             (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth,
             (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight,
             Attribs->ClearValueCount,pClearValues);
  SetViewports(this,1,(Viewport *)0x0,0,0);
  (this->m_State).ShadingRateIsSet = false;
  return;
}

Assistant:

void DeviceContextVkImpl::BeginRenderPass(const BeginRenderPassAttribs& Attribs)
{
    TDeviceContextBase::BeginRenderPass(Attribs);

    VERIFY_EXPR(m_pActiveRenderPass != nullptr);
    VERIFY_EXPR(m_pBoundFramebuffer != nullptr);
    VERIFY_EXPR(m_vkRenderPass == VK_NULL_HANDLE);
    VERIFY_EXPR(m_vkFramebuffer == VK_NULL_HANDLE);
    VERIFY_EXPR(!m_DynamicRenderingInfo);

    m_vkRenderPass  = m_pActiveRenderPass->GetVkRenderPass();
    m_vkFramebuffer = m_pBoundFramebuffer->GetVkFramebuffer();

    VkClearValue* pVkClearValues = nullptr;
    if (Attribs.ClearValueCount > 0)
    {
        m_vkClearValues.resize(Attribs.ClearValueCount);
        const RenderPassDesc& RPDesc = m_pActiveRenderPass->GetDesc();
        for (Uint32 i = 0; i < std::min(RPDesc.AttachmentCount, Attribs.ClearValueCount); ++i)
        {
            const OptimizedClearValue& ClearVal   = Attribs.pClearValues[i];
            VkClearValue&              vkClearVal = m_vkClearValues[i];

            const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(RPDesc.pAttachments[i].Format);
            if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH ||
                FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
            {
                vkClearVal.depthStencil.depth   = ClearVal.DepthStencil.Depth;
                vkClearVal.depthStencil.stencil = ClearVal.DepthStencil.Stencil;
            }
            else
            {
                vkClearVal.color.float32[0] = ClearVal.Color[0];
                vkClearVal.color.float32[1] = ClearVal.Color[1];
                vkClearVal.color.float32[2] = ClearVal.Color[2];
                vkClearVal.color.float32[3] = ClearVal.Color[3];
            }
        }
        pVkClearValues = m_vkClearValues.data();
    }

    EnsureVkCmdBuffer();
    m_CommandBuffer.BeginRenderPass(m_vkRenderPass, m_vkFramebuffer, m_FramebufferWidth, m_FramebufferHeight, Attribs.ClearValueCount, pVkClearValues);

    // Set the viewport to match the framebuffer size
    SetViewports(1, nullptr, 0, 0);

    m_State.ShadingRateIsSet = false;
}